

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

wchar_t tty_get_signal_character(EditLine *el,wchar_t sig)

{
  wchar_t wVar1;
  long lVar2;
  
  wVar1 = L'\xffffffff';
  if (((el->el_tty).t_ed.c_iflag & 0x200) != 0) {
    if (sig == L'\x02') {
      lVar2 = 0x1d9;
    }
    else if (sig == L'\x14') {
      lVar2 = 0x1e3;
    }
    else {
      if (sig != L'\x03') {
        return L'\xffffffff';
      }
      lVar2 = 0x1da;
    }
    wVar1 = (wchar_t)*(byte *)((long)&el->el_prog + lVar2);
  }
  return wVar1;
}

Assistant:

libedit_private int
tty_get_signal_character(EditLine *el, int sig)
{
#ifdef ECHOCTL
	tcflag_t *ed = tty__get_flag(&el->el_tty.t_ed, MD_INP);
	if ((*ed & ECHOCTL) == 0)
		return -1;
#endif
	switch (sig) {
#if defined(SIGINT) && defined(VINTR)
	case SIGINT:
		return el->el_tty.t_c[ED_IO][VINTR];
#endif
#if defined(SIGQUIT) && defined(VQUIT)
	case SIGQUIT:
		return el->el_tty.t_c[ED_IO][VQUIT];
#endif
#if defined(SIGINFO) && defined(VSTATUS)
	case SIGINFO:
		return el->el_tty.t_c[ED_IO][VSTATUS];
#endif
#if defined(SIGTSTP) && defined(VSUSP)
	case SIGTSTP:
		return el->el_tty.t_c[ED_IO][VSUSP];
#endif
	default:
		return -1;
	}
}